

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclSharedData.cpp
# Opt level: O0

cl_mem __thiscall
xmrig::OclSharedData::createBuffer
          (OclSharedData *this,cl_context context,size_t size,size_t *offset)

{
  long lVar1;
  size_t size_00;
  cl_mem p_Var2;
  cl_context in_RCX;
  long in_RDX;
  long *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  lock_guard<std::mutex> *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffc8;
  cl_mem_flags in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  lVar1 = in_RDI[3];
  in_RDI[3] = lVar1 + 1;
  *(long *)in_RCX = *(long *)in_RCX + in_RDX * lVar1;
  size_00 = in_RDX * in_RDI[4];
  std::max<unsigned_long>((unsigned_long *)&stack0xffffffffffffffd0,&oneGiB);
  if (*in_RDI == 0) {
    p_Var2 = OclLib::createBuffer
                       (in_RCX,in_stack_ffffffffffffffd8,size_00,in_stack_ffffffffffffffc8);
    *in_RDI = (long)p_Var2;
  }
  p_Var2 = OclLib::retain((cl_mem)0x218e91);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x218ea0);
  return p_Var2;
}

Assistant:

cl_mem xmrig::OclSharedData::createBuffer(cl_context context, size_t size, size_t &offset)
{
    std::lock_guard<std::mutex> lock(m_mutex);

    offset += size * m_offset++;
    size   = std::max(size * m_threads, oneGiB);

    if (!m_buffer) {
        m_buffer = OclLib::createBuffer(context, CL_MEM_READ_WRITE, size);
    }

    return OclLib::retain(m_buffer);
}